

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O2

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
kratos::generate_verilog_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,kratos *this,Generator *top,SystemVerilogCodeGenOptions *options)

{
  _Rb_tree_header *p_Var1;
  undefined1 local_d0 [176];
  
  if ((top->super_IRNode).fn_name_ln.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
    SystemVerilogCodeGenOptions::SystemVerilogCodeGenOptions
              ((SystemVerilogCodeGenOptions *)local_d0,(SystemVerilogCodeGenOptions *)top);
    generate_verilog_no_pkg_abi_cxx11_(__return_storage_ptr__,this,(Generator *)local_d0,options);
    SystemVerilogCodeGenOptions::~SystemVerilogCodeGenOptions
              ((SystemVerilogCodeGenOptions *)local_d0);
  }
  else {
    SystemVerilogCodeGenOptions::SystemVerilogCodeGenOptions
              ((SystemVerilogCodeGenOptions *)(local_d0 + 0x58),(SystemVerilogCodeGenOptions *)top);
    generate_verilog_pkg((Generator *)this,(SystemVerilogCodeGenOptions *)(local_d0 + 0x58));
    SystemVerilogCodeGenOptions::~SystemVerilogCodeGenOptions
              ((SystemVerilogCodeGenOptions *)(local_d0 + 0x58));
    p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
    *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
    *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, std::string> generate_verilog(Generator* top,
                                                    SystemVerilogCodeGenOptions options) {
    if (options.package_name.empty()) {
        return generate_verilog_no_pkg(top, options);
    } else {
        generate_verilog_pkg(top, options);
        return {};
    }
}